

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

void upb_Message_SetBaseField(upb_Message *msg,upb_MiniTableField *f,void *val)

{
  _Bool _Var1;
  void *to;
  void *val_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  _Var1 = upb_Message_IsFrozen(msg);
  if (_Var1) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/internal/accessors.h"
                  ,0x13b,
                  "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
                 );
  }
  _Var1 = upb_MiniTableField_IsExtension(f);
  if (!_Var1) {
    _upb_Message_SetPresence_dont_copy_me__upb_internal_use_only(msg,f);
    to = _upb_Message_MutableDataPtr_dont_copy_me__upb_internal_use_only(msg,f);
    _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only(f,to,val);
    return;
  }
  __assert_fail("!upb_MiniTableField_IsExtension(f)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/internal/accessors.h"
                ,0x13c,
                "void upb_Message_SetBaseField(struct upb_Message *, const upb_MiniTableField *, const void *)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseField(struct upb_Message* msg,
                                             const upb_MiniTableField* f,
                                             const void* val) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  UPB_ASSUME(!upb_MiniTableField_IsExtension(f));
  UPB_PRIVATE(_upb_Message_SetPresence)(msg, f);
  UPB_PRIVATE(_upb_MiniTableField_DataCopy)
  (f, UPB_PRIVATE(_upb_Message_MutableDataPtr)(msg, f), val);
}